

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall
QSynth::setDisplayCompatibilityMode
          (QSynth *this,DisplayCompatibilityMode useDisplayCompatibilityMode)

{
  Synth *this_00;
  bool bVar1;
  undefined1 local_28 [8];
  QMutexLocker<QMutex> synthLocker;
  DisplayCompatibilityMode useDisplayCompatibilityMode_local;
  QSynth *this_local;
  
  synthLocker._12_4_ = useDisplayCompatibilityMode;
  bVar1 = isRealtime(this);
  if (bVar1) {
    RealtimeHelper::setDisplayCompatibilityMode(this->realtimeHelper,synthLocker._12_4_);
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,this->synthMutex);
    this->displayCompatibilityMode = synthLocker._12_4_;
    if (this->displayCompatibilityMode == DisplayCompatibilityMode_DEFAULT) {
      this_00 = this->synth;
      bVar1 = MT32Emu::Synth::isDefaultDisplayOldMT32Compatible(this_00);
      MT32Emu::Synth::setDisplayCompatibility(this_00,bVar1);
    }
    else {
      MT32Emu::Synth::setDisplayCompatibility
                (this->synth,this->displayCompatibilityMode == DisplayCompatibilityMode_OLD_MT32);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  return;
}

Assistant:

void QSynth::setDisplayCompatibilityMode(DisplayCompatibilityMode useDisplayCompatibilityMode) {
	if (isRealtime()) {
		realtimeHelper->setDisplayCompatibilityMode(useDisplayCompatibilityMode);
	} else {
		QMutexLocker synthLocker(synthMutex);
		displayCompatibilityMode = useDisplayCompatibilityMode;
		if (DisplayCompatibilityMode_DEFAULT == displayCompatibilityMode) {
			synth->setDisplayCompatibility(synth->isDefaultDisplayOldMT32Compatible());
		} else {
			synth->setDisplayCompatibility(DisplayCompatibilityMode_OLD_MT32 == displayCompatibilityMode);
		}
	}
}